

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_4_additive_expr(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_SUB,G->val[-4],G->val[-1]);
  G->ss = pPVar1;
  G->val[-4] = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_4_additive_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define r2 G->val[-1]
#define r1 G->val[-2]
#define r G->val[-3]
#define l G->val[-4]
  yyprintf((stderr, "do yy_4_additive_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
            yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_SUB, l, r2);\n\
            l = yy;\n\
          }\n"));
  
            yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_SUB, l, r2);
            l = yy;
          ;
#undef r2
#undef r1
#undef r
#undef l
}